

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O3

size_t Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::GetAllocPlusSize(uint objectCount)

{
  bool bVar1;
  long lVar2;
  
  bVar1 = Recycler::DoProfileAllocTracker();
  lVar2 = 0;
  if (bVar1) {
    lVar2 = (ulong)objectCount << 3;
  }
  return lVar2 + ((ulong)objectCount + 7 & 0xfffffffffffffff8);
}

Assistant:

size_t
SmallHeapBlockT<TBlockAttributes>::GetAllocPlusSize(uint objectCount)
{
    // Small Heap Block Layout:
    //      TrackerData * [objectCount]  (Optional)
    //      ObjectInfo    [objectCount]  (In reverse index order)
    //      <Small*HeapBlock>

    size_t allocPlusSize = Math::Align<size_t>(sizeof(unsigned char) * objectCount, sizeof(size_t));
#ifdef PROFILE_RECYCLER_ALLOC
    if (Recycler::DoProfileAllocTracker())
    {
        allocPlusSize += objectCount * sizeof(void *);
    }
#endif
    return allocPlusSize;
}